

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O0

OwnFd kj::anon_unknown_9::DiskFilesystem::openDir(char *dir)

{
  int osErrorNumber;
  void *pvVar1;
  Fault local_40;
  Fault f;
  SyscallResult local_24;
  undefined1 local_20 [4];
  SyscallResult _kjSyscallResult;
  int _kj_fd;
  char *dir_local;
  OwnFd *result;
  
  _kjSyscallResult.errorNumber._3_1_ = 0;
  f.exception = (Exception *)local_20;
  local_24 = kj::_::Debug::
             syscall<kj::(anonymous_namespace)::DiskFilesystem::openDir(char_const*)::_lambda()_1_>
                       ((anon_class_16_2_9bf12f99 *)&f,false);
  pvVar1 = kj::_::Debug::SyscallResult::operator_cast_to_void_(&local_24);
  if (pvVar1 == (void *)0x0) {
    osErrorNumber = kj::_::Debug::SyscallResult::getErrorNumber(&local_24);
    kj::_::Debug::Fault::Fault
              (&local_40,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
               ,0x68e,osErrorNumber,"_kj_fd = open(dir, 00 | 02000000 | 0200000)","");
    kj::_::Debug::Fault::fatal(&local_40);
  }
  OwnFd::OwnFd((OwnFd *)dir,(int)local_20);
  return (OwnFd)(int)dir;
}

Assistant:

static OwnFd openDir(const char* dir) {
    auto result = KJ_SYSCALL_FD(open(dir, O_RDONLY | MAYBE_O_CLOEXEC | MAYBE_O_DIRECTORY));
#ifndef O_CLOEXEC
    setCloexec(result);
#endif
    return result;
  }